

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_CrouchMove(player_t *player,int direction)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  APlayerPawn *pAVar6;
  double dVar7;
  double dVar8;
  DVector2 local_28;
  PClass *pPVar5;
  
  pAVar6 = player->mo;
  pPVar5 = (pAVar6->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar4 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
    (pAVar6->super_AActor).super_DThinker.super_DObject.Class = pPVar5;
    pAVar6 = player->mo;
  }
  dVar1 = (pAVar6->super_AActor).Height;
  dVar2 = player->viewheight;
  dVar7 = player->crouchfactor + (double)direction * 0.08333333333333333;
  dVar8 = *(double *)(pPVar5->Defaults + 0x180);
  player->crouchdir = (SBYTE)direction;
  player->crouchfactor = dVar7;
  (pAVar6->super_AActor).Height = dVar8 * dVar7;
  local_28.X = (pAVar6->super_AActor).__Pos.X;
  local_28.Y = (pAVar6->super_AActor).__Pos.Y;
  bVar3 = P_TryMove(&pAVar6->super_AActor,&local_28,0,(secplane_t *)0x0);
  pAVar6 = player->mo;
  if ((bVar3) || ((pAVar6->super_AActor).Height = dVar1, direction < 1)) {
    (pAVar6->super_AActor).Height = dVar1;
    dVar1 = player->crouchfactor;
    dVar8 = 1.0;
    if (dVar1 <= 1.0) {
      dVar8 = dVar1;
    }
    dVar8 = (double)(~-(ulong)(0.5 < dVar1) & 0x3fe0000000000000 |
                    (ulong)dVar8 & -(ulong)(0.5 < dVar1));
    player->crouchfactor = dVar8;
    dVar1 = pAVar6->ViewHeight;
    dVar8 = dVar8 * dVar1;
    player->viewheight = dVar8;
    player->crouchviewdelta = dVar8 - dVar1;
    P_CheckFakeFloorTriggers(&pAVar6->super_AActor,dVar2 + (pAVar6->super_AActor).__Pos.Z,true);
  }
  else {
    player->crouchfactor = player->crouchfactor - (double)direction * 0.08333333333333333;
  }
  return;
}

Assistant:

void P_CrouchMove(player_t * player, int direction)
{
	double defaultheight = player->mo->GetDefault()->Height;
	double savedheight = player->mo->Height;
	double crouchspeed = direction * CROUCHSPEED;
	double oldheight = player->viewheight;

	player->crouchdir = (signed char) direction;
	player->crouchfactor += crouchspeed;

	// check whether the move is ok
	player->mo->Height  = defaultheight * player->crouchfactor;
	if (!P_TryMove(player->mo, player->mo->Pos(), false, NULL))
	{
		player->mo->Height = savedheight;
		if (direction > 0)
		{
			// doesn't fit
			player->crouchfactor -= crouchspeed;
			return;
		}
	}
	player->mo->Height = savedheight;

	player->crouchfactor = clamp(player->crouchfactor, 0.5, 1.);
	player->viewheight = player->mo->ViewHeight * player->crouchfactor;
	player->crouchviewdelta = player->viewheight - player->mo->ViewHeight;

	// Check for eyes going above/below fake floor due to crouching motion.
	P_CheckFakeFloorTriggers(player->mo, player->mo->Z() + oldheight, true);
}